

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O3

void sei_append_708(sei_t *sei,cea708_t *cea708)

{
  int iVar1;
  _sei_message_t *p_Var2;
  
  p_Var2 = (_sei_message_t *)malloc(0x117);
  p_Var2->next = (_sei_message_t *)0x0;
  p_Var2->type = sei_type_user_data_registered_itu_t_t35;
  p_Var2->size = 0xff;
  memset(p_Var2 + 1,0,0xff);
  iVar1 = cea708_render(cea708,(uint8_t *)(p_Var2 + 1),0xff);
  p_Var2->size = (long)iVar1;
  if (sei->head == (sei_message_t *)0x0) {
    sei->head = p_Var2;
  }
  else {
    sei->tail->next = p_Var2;
  }
  sei->tail = p_Var2;
  cea708_init(cea708,sei->timestamp);
  return;
}

Assistant:

void sei_append_708(sei_t* sei, cea708_t* cea708)
{
    sei_message_t* msg = sei_message_new(sei_type_user_data_registered_itu_t_t35, 0, CEA608_MAX_SIZE);
    msg->size = cea708_render(cea708, sei_message_data(msg), sei_message_size(msg));
    sei_message_append(sei, msg);
    cea708_init(cea708, sei->timestamp); // will confgure using HLS compatiable defaults
}